

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

Track * __thiscall mkvparser::Tracks::GetTrackByNumber(Tracks *this,long tn)

{
  Track *pTVar1;
  Track *in_RAX;
  Track **ppTVar2;
  bool bVar3;
  
  if (-1 < tn) {
    for (ppTVar2 = this->m_trackEntries; ppTVar2 != this->m_trackEntriesEnd; ppTVar2 = ppTVar2 + 1)
    {
      pTVar1 = *ppTVar2;
      if (pTVar1 == (Track *)0x0) {
        bVar3 = false;
      }
      else {
        bVar3 = (pTVar1->m_info).number == tn;
        if (bVar3) {
          in_RAX = pTVar1;
        }
      }
      if (bVar3) {
        return in_RAX;
      }
    }
  }
  return (Track *)0x0;
}

Assistant:

const Track* Tracks::GetTrackByNumber(long tn) const {
  if (tn < 0)
    return NULL;

  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;

    if (pTrack == NULL)
      continue;

    if (tn == pTrack->GetNumber())
      return pTrack;
  }

  return NULL;  // not found
}